

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O1

unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> __thiscall
cmCryptoHash::New(cmCryptoHash *this,char *algo)

{
  int iVar1;
  cmCryptoHash *this_00;
  
  iVar1 = strcmp(algo,"MD5");
  if (iVar1 == 0) {
    this_00 = (cmCryptoHash *)operator_new(0x10);
    cmCryptoHash(this_00,AlgoMD5);
  }
  else {
    iVar1 = strcmp(algo,"SHA1");
    if (iVar1 == 0) {
      this_00 = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(this_00,AlgoSHA1);
    }
    else {
      iVar1 = strcmp(algo,"SHA224");
      if (iVar1 == 0) {
        this_00 = (cmCryptoHash *)operator_new(0x10);
        cmCryptoHash(this_00,AlgoSHA224);
      }
      else {
        iVar1 = strcmp(algo,"SHA256");
        if (iVar1 == 0) {
          this_00 = (cmCryptoHash *)operator_new(0x10);
          cmCryptoHash(this_00,AlgoSHA256);
        }
        else {
          iVar1 = strcmp(algo,"SHA384");
          if (iVar1 == 0) {
            this_00 = (cmCryptoHash *)operator_new(0x10);
            cmCryptoHash(this_00,AlgoSHA384);
          }
          else {
            iVar1 = strcmp(algo,"SHA512");
            if (iVar1 == 0) {
              this_00 = (cmCryptoHash *)operator_new(0x10);
              cmCryptoHash(this_00,AlgoSHA512);
            }
            else {
              iVar1 = strcmp(algo,"SHA3_224");
              if (iVar1 != 0) {
                iVar1 = strcmp(algo,"SHA3_256");
                if (((iVar1 != 0) && (iVar1 = strcmp(algo,"SHA3_384"), iVar1 != 0)) &&
                   (iVar1 = strcmp(algo,"SHA3_512"), iVar1 != 0)) {
                  *(undefined8 *)this = 0;
                  return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>
                          )(__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>
                            )this;
                }
                std::make_unique<cmCryptoHash,cmCryptoHash::Algo>(&this->Id);
                return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>
                       )(__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>
                         )this;
              }
              this_00 = (cmCryptoHash *)operator_new(0x10);
              cmCryptoHash(this_00,AlgoSHA3_224);
            }
          }
        }
      }
    }
  }
  *(cmCryptoHash **)this = this_00;
  return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
         (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCryptoHash> cmCryptoHash::New(const char* algo)
{
  if (strcmp(algo, "MD5") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoMD5);
  }
  if (strcmp(algo, "SHA1") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA1);
  }
  if (strcmp(algo, "SHA224") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA224);
  }
  if (strcmp(algo, "SHA256") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA256);
  }
  if (strcmp(algo, "SHA384") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA384);
  }
  if (strcmp(algo, "SHA512") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA512);
  }
  if (strcmp(algo, "SHA3_224") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_224);
  }
  if (strcmp(algo, "SHA3_256") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_256);
  }
  if (strcmp(algo, "SHA3_384") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_384);
  }
  if (strcmp(algo, "SHA3_512") == 0) {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_512);
  }
  return std::unique_ptr<cmCryptoHash>(nullptr);
}